

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall xercesc_4_0::TraverseSchema::traverseInclude(TraverseSchema *this,DOMElement *elem)

{
  SchemaInfo *pSVar1;
  SchemaInfo *this_00;
  DOMElement *root;
  SchemaInfo *saveInfo;
  SchemaInfo *includeInfo;
  NamespaceScopeManager nsMgr;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)elem;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)&includeInfo,elem,this->fSchemaInfo,this);
  this_00 = RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher>::get
                      (this->fPreprocessedNodes,nsMgr.fSchemaInfo);
  if (this_00 != (SchemaInfo *)0x0) {
    pSVar1 = this->fSchemaInfo;
    this->fSchemaInfo = this_00;
    root = SchemaInfo::getRoot(this_00);
    processChildren(this,root);
    this->fSchemaInfo = pSVar1;
  }
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)&includeInfo);
  return;
}

Assistant:

void TraverseSchema::traverseInclude(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    SchemaInfo* includeInfo = fPreprocessedNodes->get(elem);

    if (includeInfo) {

        SchemaInfo* saveInfo = fSchemaInfo;

        fSchemaInfo = includeInfo;
        processChildren(includeInfo->getRoot());
        fSchemaInfo = saveInfo;
    }
}